

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

bool CheckEthernetV2(AmpIO *Board)

{
  bool bVar1;
  ostream *poVar2;
  uint16_t local_1a;
  uint8_t local_18;
  uchar local_17 [5];
  uint16_t HashValue;
  uint8_t HashReg;
  uchar MulticastMAC [6];
  bool ret;
  AmpIO *Board_local;
  
  _HashReg = Board;
  poVar2 = std::operator<<((ostream *)&std::cout,"Checking --- start ---");
  std::operator<<(poVar2,"\n");
  HashValue._1_1_ = 1;
  bVar1 = CheckRegister(_HashReg,'\x10',0xfff0,0x9400);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,'\x12',0xffff,0xe13);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,'\x14',0xffff,0xfa61);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,0x84,0x4000,0x4000);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,'p',0x1ff,0x1ef);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,0x86,0x4000,0x4000);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,0x9c,0xff,1);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,'t',0xffff,0x7ce1);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  EthBasePort::GetDestMulticastMacAddr(local_17);
  ComputeMulticastHash(local_17,&local_18,&local_1a);
  bVar1 = CheckRegister(_HashReg,local_18,0xffff,local_1a);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,0x82,0x3f7,0x20);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  bVar1 = CheckRegister(_HashReg,0x90,0xffff,0xa000);
  HashValue._1_1_ = (HashValue._1_1_ & 1 & bVar1) != 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"Checking ---- end ----");
  std::operator<<(poVar2,"\n");
  return (bool)(HashValue._1_1_ & 1);
}

Assistant:

bool CheckEthernetV2(AmpIO &Board)
{
    std::cout << "Checking --- start ---" << "\n";
    bool ret = true;
    ret &= CheckRegister(Board, 0x10, 0xfff0, 0x9400);  // MAC address low = 0x940n (n = board id)
    ret &= CheckRegister(Board, 0x12, 0xffff, 0x0E13);  // MAC address middle = 0xOE13
    ret &= CheckRegister(Board, 0x14, 0xffff, 0xFA61);  // MAC address high = 0xFA61
    ret &= CheckRegister(Board, 0x84, 0x4000, 0x4000);  // Enable QMU transmit frame data pointer auto increment
    ret &= CheckRegister(Board, 0x70, 0x01ff, 0x01EF);  // Enable QMU transmit flow control, CRC, padding, and transmit module
    ret &= CheckRegister(Board, 0x86, 0x4000, 0x4000);  // Enable QMU receive frame data pointer auto increment
    ret &= CheckRegister(Board, 0x9C, 0x00ff, 0x0001);  // Configure receive frame threshold for 1 frame
    ret &= CheckRegister(Board, 0x74, 0xffff, 0x7CE1);  // Enable checksums, MAC address filtering, and receive module
    // Check multicast hash table
    unsigned char MulticastMAC[6];
    EthBasePort::GetDestMulticastMacAddr(MulticastMAC);
    uint8_t HashReg;
    uint16_t HashValue;
    ComputeMulticastHash(MulticastMAC, HashReg, HashValue);
    ret &= CheckRegister(Board, HashReg, 0xffff, HashValue);
    ret &= CheckRegister(Board, 0x82, 0x03f7, 0x0020);  // Enable QMU frame count threshold (1), no auto-dequeue
    ret &= CheckRegister(Board, 0x90, 0xffff, 0xa000);  // Enable receive and link change interrupts
    std::cout << "Checking ---- end ----" << "\n";
    return ret;
}